

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O2

void __thiscall raptor::TcpServer::RefreshTime(TcpServer *this,uint32_t index)

{
  size_t sVar1;
  time_t tVar2;
  iterator iVar3;
  pair<const_long,_unsigned_int> local_40;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->_conn_mtx);
  if ((this->_mgr).
      super__Vector_base<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>,_std::allocator<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[index].first.
      super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    tVar2 = Now();
    sVar1 = (this->_options).connection_timeout;
    std::
    _Rb_tree<long,std::pair<long_const,unsigned_int>,std::_Select1st<std::pair<long_const,unsigned_int>>,std::less<long>,std::allocator<std::pair<long_const,unsigned_int>>>
    ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,unsigned_int>,std::_Select1st<std::pair<long_const,unsigned_int>>,std::less<long>,std::allocator<std::pair<long_const,unsigned_int>>>
                        *)&this->_timeout_record_list,
                       (this->_mgr).
                       super__Vector_base<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>,_std::allocator<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[index].second._M_node);
    local_40.first = sVar1 + tVar2;
    local_40.second = index;
    iVar3 = std::
            _Rb_tree<long,std::pair<long_const,unsigned_int>,std::_Select1st<std::pair<long_const,unsigned_int>>,std::less<long>,std::allocator<std::pair<long_const,unsigned_int>>>
            ::_M_insert_equal<std::pair<long_const,unsigned_int>>
                      ((_Rb_tree<long,std::pair<long_const,unsigned_int>,std::_Select1st<std::pair<long_const,unsigned_int>>,std::less<long>,std::allocator<std::pair<long_const,unsigned_int>>>
                        *)&this->_timeout_record_list,&local_40);
    (this->_mgr).
    super__Vector_base<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>,_std::allocator<std::pair<std::shared_ptr<raptor::Connection>,_std::_Rb_tree_iterator<std::pair<const_long,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[index].second._M_node = iVar3._M_node;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_conn_mtx);
  return;
}

Assistant:

void TcpServer::RefreshTime(uint32_t index) {
    AutoMutex g(&_conn_mtx);
    if (!_mgr[index].first) {
        return;
    }
    time_t deadline_seconds = Now() + _options.connection_timeout;
    _timeout_record_list.erase(_mgr[index].second);
    _mgr[index].second = _timeout_record_list.insert({deadline_seconds, index});
}